

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O0

void __thiscall FGameConfigFile::ArchiveGameData(FGameConfigFile *this,char *gamename)

{
  size_t sVar1;
  int iVar2;
  char *__dest;
  char *pcVar3;
  char *subsection;
  char section [96];
  char *gamename_local;
  FGameConfigFile *this_local;
  
  section._88_8_ = gamename;
  iVar2 = mysnprintf((char *)&subsection,0x60,"%s.",gamename);
  this->sublen = 0x5f - (long)iVar2;
  sVar1 = this->sublen;
  __dest = section + -sVar1 + 0x57;
  strncpy(__dest,"Player",this->sublen);
  FConfigFile::SetSection(&this->super_FConfigFile,(char *)&subsection,true);
  FConfigFile::ClearCurrentSection(&this->super_FConfigFile);
  C_ArchiveCVars(&this->super_FConfigFile,3);
  if ((this->bModSetup & 1U) != 0) {
    strncpy(section + -sVar1 + 0x5d,".Mod",this->sublen - 6);
    FConfigFile::SetSection(&this->super_FConfigFile,(char *)&subsection,true);
    FConfigFile::ClearCurrentSection(&this->super_FConfigFile);
    C_ArchiveCVars(&this->super_FConfigFile,0x2103);
  }
  strncpy(__dest,"ConsoleVariables",this->sublen);
  FConfigFile::SetSection(&this->super_FConfigFile,(char *)&subsection,true);
  FConfigFile::ClearCurrentSection(&this->super_FConfigFile);
  C_ArchiveCVars(&this->super_FConfigFile,1);
  if (((netgame & 1U) == 0) || (consoleplayer == 0)) {
    pcVar3 = "LocalServerInfo";
    if ((netgame & 1U) != 0) {
      pcVar3 = "NetServerInfo";
    }
    strncpy(__dest,pcVar3,this->sublen);
    FConfigFile::SetSection(&this->super_FConfigFile,(char *)&subsection,true);
    FConfigFile::ClearCurrentSection(&this->super_FConfigFile);
    C_ArchiveCVars(&this->super_FConfigFile,5);
    if ((this->bModSetup & 1U) != 0) {
      pcVar3 = "LocalServerInfo.Mod";
      if ((netgame & 1U) != 0) {
        pcVar3 = "NetServerInfo.Mod";
      }
      strncpy(__dest,pcVar3,this->sublen);
      FConfigFile::SetSection(&this->super_FConfigFile,(char *)&subsection,true);
      FConfigFile::ClearCurrentSection(&this->super_FConfigFile);
      C_ArchiveCVars(&this->super_FConfigFile,0x2105);
    }
  }
  strncpy(__dest,"UnknownConsoleVariables",this->sublen);
  FConfigFile::SetSection(&this->super_FConfigFile,(char *)&subsection,true);
  FConfigFile::ClearCurrentSection(&this->super_FConfigFile);
  C_ArchiveCVars(&this->super_FConfigFile,0x101);
  strncpy(__dest,"ConsoleAliases",this->sublen);
  FConfigFile::SetSection(&this->super_FConfigFile,(char *)&subsection,true);
  FConfigFile::ClearCurrentSection(&this->super_FConfigFile);
  C_ArchiveAliases(&this->super_FConfigFile);
  M_SaveCustomKeys(&this->super_FConfigFile,(char *)&subsection,__dest,this->sublen);
  strcpy(__dest,"Bindings");
  FConfigFile::SetSection(&this->super_FConfigFile,(char *)&subsection,true);
  FKeyBindings::ArchiveBindings(&Bindings,&this->super_FConfigFile,(char *)0x0);
  strncpy(__dest,"DoubleBindings",this->sublen);
  FConfigFile::SetSection(&this->super_FConfigFile,(char *)&subsection,true);
  FKeyBindings::ArchiveBindings(&DoubleBindings,&this->super_FConfigFile,(char *)0x0);
  strncpy(__dest,"AutomapBindings",this->sublen);
  FConfigFile::SetSection(&this->super_FConfigFile,(char *)&subsection,true);
  FKeyBindings::ArchiveBindings(&AutomapBindings,&this->super_FConfigFile,(char *)0x0);
  return;
}

Assistant:

void FGameConfigFile::ArchiveGameData (const char *gamename)
{
	char section[32*3], *subsection;

	sublen = countof(section) - 1 - mysnprintf (section, countof(section), "%s.", gamename);
	subsection = section + countof(section) - 1 - sublen;

	strncpy (subsection, "Player", sublen);
	SetSection (section, true);
	ClearCurrentSection ();
	C_ArchiveCVars (this, CVAR_ARCHIVE|CVAR_USERINFO);

	if (bModSetup)
	{
		strncpy (subsection + 6, ".Mod", sublen - 6);
		SetSection (section, true);
		ClearCurrentSection ();
		C_ArchiveCVars (this, CVAR_MOD|CVAR_ARCHIVE|CVAR_AUTO|CVAR_USERINFO);
	}

	strncpy (subsection, "ConsoleVariables", sublen);
	SetSection (section, true);
	ClearCurrentSection ();
	C_ArchiveCVars (this, CVAR_ARCHIVE);

	// Do not overwrite the serverinfo section if playing a netgame, and
	// this machine was not the initial host.
	if (!netgame || consoleplayer == 0)
	{
		strncpy (subsection, netgame ? "NetServerInfo" : "LocalServerInfo", sublen);
		SetSection (section, true);
		ClearCurrentSection ();
		C_ArchiveCVars (this, CVAR_ARCHIVE|CVAR_SERVERINFO);

		if (bModSetup)
		{
			strncpy (subsection, netgame ? "NetServerInfo.Mod" : "LocalServerInfo.Mod", sublen);
			SetSection (section, true);
			ClearCurrentSection ();
			C_ArchiveCVars (this, CVAR_MOD|CVAR_ARCHIVE|CVAR_AUTO|CVAR_SERVERINFO);
		}
	}

	strncpy (subsection, "UnknownConsoleVariables", sublen);
	SetSection (section, true);
	ClearCurrentSection ();
	C_ArchiveCVars (this, CVAR_ARCHIVE|CVAR_AUTO);

	strncpy (subsection, "ConsoleAliases", sublen);
	SetSection (section, true);
	ClearCurrentSection ();
	C_ArchiveAliases (this);

	M_SaveCustomKeys (this, section, subsection, sublen);

	strcpy (subsection, "Bindings");
	SetSection (section, true);
	Bindings.ArchiveBindings (this);

	strncpy (subsection, "DoubleBindings", sublen);
	SetSection (section, true);
	DoubleBindings.ArchiveBindings (this);

	strncpy (subsection, "AutomapBindings", sublen);
	SetSection (section, true);
	AutomapBindings.ArchiveBindings (this);
}